

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
* __thiscall
Lib::
Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::insert(Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> **key,
        Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
        *val,uint code)

{
  bool bVar1;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *pPVar2;
  uint in_ECX;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *in_RDX;
  undefined8 *in_RSI;
  Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  *in_RDI;
  Entry *entry;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffa8;
  Entry *this_00;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffb0;
  EVP_PKEY_CTX *ctx;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_40;
  Entry *local_30;
  uint local_24;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *local_20;
  undefined8 *local_18;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = firstEntryForCode(in_RDI,in_ECX);
  do {
    bVar1 = Entry::occupied(local_30);
    if (!bVar1) {
      in_RDI->_noOfEntries = in_RDI->_noOfEntries + 1;
      ctx = (EVP_PKEY_CTX *)*local_18;
      this_00 = local_30;
      Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
      ::Perfect(&local_40,local_20);
      Entry::init(this_00,ctx);
      pPVar2 = Entry::value(local_30);
      return pPVar2;
    }
    if (local_30->code == local_24) {
      Entry::key(local_30);
      bVar1 = DerefPtrHash<Lib::StlHash>::
              equals<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>>
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        pPVar2 = Entry::value(local_30);
        return pPVar2;
      }
    }
    local_30 = nextEntry(in_RDI,local_30);
  } while( true );
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }